

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

void __thiscall GYMPlayer::GYMPlayer(GYMPlayer *this)

{
  value_type local_38 [3];
  UINT8 local_19;
  ulong uStack_18;
  UINT8 retVal;
  size_t curDev;
  GYMPlayer *this_local;
  
  curDev = (size_t)this;
  PlayerBase::PlayerBase(&this->super_PlayerBase);
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__GYMPlayer_001f3db8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_decFData);
  std::vector<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>::vector(&this->_devCfgs);
  this->_tickFreq = 0x3c;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->_tagData);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->_tagList);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_pcmBuffer);
  std::vector<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>::vector
            (&this->_devices);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_devNames);
  this->_filePos = 0;
  this->_fileTick = 0;
  this->_playTick = 0;
  this->_playSmpl = 0;
  this->_curLoop = 0;
  this->_playState = '\0';
  this->_psTrigger = '\0';
  ::dev_logger_set(&this->_logger,this,PlayerLogCB,(void *)0x0);
  (this->_playOpts).genOpts.pbSpeed = 0x10000;
  this->_lastTsMult = 0;
  this->_lastTsDiv = 0;
  for (uStack_18 = 0; uStack_18 < 2; uStack_18 = uStack_18 + 1) {
    PlayerBase::InitDeviceOptions(this->_devOpts + uStack_18);
  }
  GenerateDeviceConfig(this);
  local_19 = CPConv_Init(&this->_cpc1252,"CP1252","UTF-8");
  if (local_19 != '\0') {
    this->_cpc1252 = (CPCONV *)0x0;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve(&this->_tagList,0x10);
  local_38[0] = (value_type)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&this->_tagList,local_38);
  return;
}

Assistant:

GYMPlayer::GYMPlayer() :
	_tickFreq(60),
	_filePos(0),
	_fileTick(0),
	_playTick(0),
	_playSmpl(0),
	_curLoop(0),
	_playState(0x00),
	_psTrigger(0x00)
{
	size_t curDev;
	UINT8 retVal;
	
	dev_logger_set(&_logger, this, GYMPlayer::PlayerLogCB, NULL);

	_playOpts.genOpts.pbSpeed = 0x10000;

	_lastTsMult = 0;
	_lastTsDiv = 0;
	
	for (curDev = 0; curDev < 2; curDev ++)
		InitDeviceOptions(_devOpts[curDev]);
	GenerateDeviceConfig();
	
	retVal = CPConv_Init(&_cpc1252, "CP1252", "UTF-8");
	if (retVal)
		_cpc1252 = NULL;
	_tagList.reserve(16);
	_tagList.push_back(NULL);
}